

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_mc_flow_dispenser_mt(AV1_COMP *cpi)

{
  AV1_COMP *cpi_00;
  long *in_RDI;
  ThreadData *td;
  EncWorkerData *thread_data;
  int i;
  int num_workers;
  int mb_rows;
  AV1TplRowMultiThreadSync *tpl_sync;
  TplParams *tpl_data;
  MultiThreadInfo *mt_info;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  int in_stack_00000174;
  AV1_COMMON *in_stack_00000178;
  MultiThreadInfo *in_stack_00000180;
  int local_54;
  AV1TplRowMultiThreadSync *in_stack_ffffffffffffffb0;
  AV1_COMMON *in_stack_ffffffffffffffb8;
  int num_workers_00;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int iVar1;
  
  cpi_00 = (AV1_COMP *)(*in_RDI + 0x12328);
  iVar1 = (int)in_RDI[0x7831];
  if (*(int *)((long)in_RDI + 0x9ae54) < (int)in_RDI[0x135c9]) {
    local_54 = *(int *)((long)in_RDI + 0x9ae54);
  }
  else {
    local_54 = (int)in_RDI[0x135c9];
  }
  if (iVar1 != *(int *)(*in_RDI + 0x12344)) {
    av1_tpl_dealloc(in_stack_ffffffffffffffb0);
    av1_tpl_alloc((AV1TplRowMultiThreadSync *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  }
  num_workers_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  *(int *)(cpi_00->enc_quant_dequant_params).quants.y_quant[1] = local_54;
  *(undefined1 *)(in_RDI + 0x135ff) = 0;
  memset(*(void **)(cpi_00->enc_quant_dequant_params).quants.y_quant[0],0xff,(long)iVar1 << 2);
  prepare_tpl_workers(cpi_00,(AVxWorkerHook)CONCAT44(iVar1,local_54),in_stack_ffffffffffffffc4);
  launch_workers((MultiThreadInfo *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 num_workers_00);
  sync_enc_workers(in_stack_00000180,in_stack_00000178,in_stack_00000174);
  while (local_54 = local_54 + -1, -1 < local_54) {
    if (*(long **)(in_RDI[0x135d1] + (long)local_54 * 0x1d0 + 8) != in_RDI + 0x2a06) {
      tpl_dealloc_temp_buffers((TplBuffers *)0x25b760);
    }
  }
  return;
}

Assistant:

void av1_mc_flow_dispenser_mt(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CommonModeInfoParams *mi_params = &cm->mi_params;
  MultiThreadInfo *mt_info = &cpi->mt_info;
  TplParams *tpl_data = &cpi->ppi->tpl_data;
  AV1TplRowMultiThreadSync *tpl_sync = &tpl_data->tpl_mt_sync;
  int mb_rows = mi_params->mb_rows;
  int num_workers =
      AOMMIN(mt_info->num_mod_workers[MOD_TPL], mt_info->num_workers);

  if (mb_rows != tpl_sync->rows) {
    av1_tpl_dealloc(tpl_sync);
    av1_tpl_alloc(tpl_sync, cm, mb_rows);
  }
  tpl_sync->num_threads_working = num_workers;
  mt_info->tpl_row_mt.tpl_mt_exit = false;

  // Initialize cur_mb_col to -1 for all MB rows.
  memset(tpl_sync->num_finished_cols, -1,
         sizeof(*tpl_sync->num_finished_cols) * mb_rows);

  prepare_tpl_workers(cpi, tpl_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
#if CONFIG_BITRATE_ACCURACY
  tpl_accumulate_txfm_stats(&cpi->td, &cpi->mt_info, num_workers);
#endif  // CONFIG_BITRATE_ACCURACY
  for (int i = num_workers - 1; i >= 0; i--) {
    EncWorkerData *thread_data = &mt_info->tile_thr_data[i];
    ThreadData *td = thread_data->td;
    if (td != &cpi->td) tpl_dealloc_temp_buffers(&td->tpl_tmp_buffers);
  }
}